

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

Ssc_Man_t * Ssc_ManStart(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  byte bVar1;
  int iVar2;
  sat_solver *psVar3;
  int **ppiVar4;
  int iVar5;
  uint uVar6;
  Ssc_Man_t *pSVar7;
  Gia_Man_t *p;
  Vec_Int_t *pVVar8;
  int *piVar9;
  char *__s;
  
  pSVar7 = (Ssc_Man_t *)calloc(1,0xd0);
  pSVar7->pPars = pPars;
  pSVar7->pAig = pAig;
  pSVar7->pCare = pCare;
  p = Gia_ManDupDfs(pCare);
  pSVar7->pFraig = p;
  if ((p->vHTable).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->pFraig->vHTable) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/ssc/sscCore.c"
                  ,0x58,"Ssc_Man_t *Ssc_ManStart(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)");
  }
  iVar5 = Gia_ManHasDangling(p);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ManHasDangling(p->pFraig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/ssc/sscCore.c"
                  ,0x59,"Ssc_Man_t *Ssc_ManStart(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)");
  }
  Gia_ManInvertPos(pSVar7->pFraig);
  Ssc_ManStartSolver(pSVar7);
  if (pSVar7->pSat == (sat_solver *)0x0) {
    __s = "Constraints are UNSAT after propagation.";
LAB_00600702:
    puts(__s);
    Ssc_ManStop(pSVar7);
    pSVar7 = (Ssc_Man_t *)0x1;
  }
  else {
    pVVar8 = Ssc_ManFindPivotSat(pSVar7);
    pSVar7->vPivot = pVVar8;
    if (pVVar8 == (Vec_Int_t *)0x0) {
      puts("Conflict limit is reached while trying to find one SAT assignment.");
    }
    else {
      if (pVVar8 == (Vec_Int_t *)0x1) {
        __s = "Constraints are UNSAT.";
        goto LAB_00600702;
      }
      psVar3 = pSVar7->pSat;
      if (psVar3->qhead != psVar3->qtail) {
        __assert_fail("s->qhead == s->qtail",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x137,"void sat_solver_bookmark(sat_solver *)");
      }
      iVar5 = psVar3->size;
      psVar3->iVarPivot = iVar5;
      psVar3->iTrailPivot = psVar3->qhead;
      *(undefined8 *)(psVar3->Mem).BookMarkE = *(undefined8 *)(psVar3->Mem).nEntries;
      iVar2 = (psVar3->Mem).iPage[0];
      bVar1 = (byte)(psVar3->Mem).nPageSize;
      ppiVar4 = (psVar3->Mem).pPages;
      (psVar3->Mem).BookMarkH[0] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
      iVar2 = (psVar3->Mem).iPage[1];
      (psVar3->Mem).BookMarkH[1] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
      if (psVar3->activity2 != (word *)0x0) {
        psVar3->var_inc2 = psVar3->var_inc;
        memcpy(psVar3->activity2,psVar3->activity,(long)iVar5 << 3);
      }
      Gia_ManSetPhasePattern(pSVar7->pAig,pSVar7->vPivot);
      Gia_ManSetPhasePattern(pSVar7->pCare,pSVar7->vPivot);
      iVar5 = Gia_ManCheckCoPhase(pSVar7->pCare);
      if (iVar5 == 0) {
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 100;
        pVVar8->nSize = 0;
        piVar9 = (int *)malloc(400);
        pVVar8->pArray = piVar9;
        pSVar7->vDisPairs = pVVar8;
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 100;
        pVVar8->nSize = 0;
        piVar9 = (int *)malloc(400);
        pVVar8->pArray = piVar9;
        pSVar7->vPattern = pVVar8;
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 100;
        pVVar8->nSize = 0;
        piVar9 = (int *)malloc(400);
        pVVar8->pArray = piVar9;
        pSVar7->vFanins = pVVar8;
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 100;
        pVVar8->nSize = 0;
        piVar9 = (int *)malloc(400);
        pVVar8->pArray = piVar9;
        pSVar7->vFront = pVVar8;
        Ssc_GiaClassesInit(pAig);
        return pSVar7;
      }
      uVar6 = Gia_ManCheckCoPhase(pSVar7->pCare);
      printf("Computed reference pattern violates %d constraints (this is a bug!).\n",(ulong)uVar6);
    }
    Ssc_ManStop(pSVar7);
    pSVar7 = (Ssc_Man_t *)0x0;
  }
  return pSVar7;
}

Assistant:

Ssc_Man_t * Ssc_ManStart( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    p = ABC_CALLOC( Ssc_Man_t, 1 );
    p->pPars  = pPars;
    p->pAig   = pAig;
    p->pCare  = pCare;
    p->pFraig = Gia_ManDupDfs( p->pCare );
    assert( Vec_IntSize(&p->pFraig->vHTable) == 0 );
    assert( !Gia_ManHasDangling(p->pFraig) );
    Gia_ManInvertPos( p->pFraig );
    Ssc_ManStartSolver( p );
    if ( p->pSat == NULL )
    {
        printf( "Constraints are UNSAT after propagation.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
//    p->vPivot = Ssc_GiaFindPivotSim( p->pFraig );
//    Vec_IntFreeP( &p->vPivot  );
    p->vPivot = Ssc_ManFindPivotSat( p );
    if ( p->vPivot == (Vec_Int_t *)(ABC_PTRINT_T)1 )
    {
        printf( "Constraints are UNSAT.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
    if ( p->vPivot == NULL )
    {
        printf( "Conflict limit is reached while trying to find one SAT assignment.\n" );
        Ssc_ManStop( p );
        return NULL;
    }
    sat_solver_bookmark( p->pSat );
//    Vec_IntPrint( p->vPivot );
    Gia_ManSetPhasePattern( p->pAig, p->vPivot );
    Gia_ManSetPhasePattern( p->pCare, p->vPivot );
    if ( Gia_ManCheckCoPhase(p->pCare) )
    {
        printf( "Computed reference pattern violates %d constraints (this is a bug!).\n", Gia_ManCheckCoPhase(p->pCare) );
        Ssc_ManStop( p );
        return NULL;
    }
    // other things
    p->vDisPairs = Vec_IntAlloc( 100 );
    p->vPattern = Vec_IntAlloc( 100 );
    p->vFanins = Vec_IntAlloc( 100 );
    p->vFront = Vec_IntAlloc( 100 );
    Ssc_GiaClassesInit( pAig );
    // now it is ready for refinement using simulation 
    return p;
}